

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Runtime.cpp
# Opt level: O1

void runtime::printConstantArray<std::__cxx11::string>
               (ostream *out,
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *vec)

{
  pointer pbVar1;
  undefined8 in_RAX;
  ostream *poVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *val;
  pointer pbVar3;
  undefined8 uStack_38;
  
  pbVar1 = (vec->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  uStack_38 = in_RAX;
  for (pbVar3 = (vec->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start; pbVar3 != pbVar1; pbVar3 = pbVar3 + 1) {
    std::__ostream_insert<char,std::char_traits<char>>(out,"| |",3);
    poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)out);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"| ",2);
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar2,(pbVar3->_M_dataplus)._M_p,pbVar3->_M_string_length);
    uStack_38 = CONCAT17(10,(undefined7)uStack_38);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,(char *)((long)&uStack_38 + 7),1);
  }
  return;
}

Assistant:

void printConstantArray(std::ostream & out, const std::vector<T> & vec) {
  std::size_t i = 0;
  for (const auto& val : vec) {
    out << "| |" << i << "| " << val << '\n';
    i++;
  }
}